

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue JS_GetPrototype(JSContext *ctx,JSValue obj)

{
  JSRefCountHeader *p;
  JSValueUnion JVar1;
  int iVar2;
  ulong uVar3;
  int64_t iVar4;
  long lVar5;
  long lVar6;
  JSValue JVar7;
  JSValue JVar8;
  
  iVar2 = (int)obj.tag;
  if (iVar2 == -1) {
    if (*(short *)((long)obj.u.ptr + 6) == 0x29) {
      JVar8 = js_proxy_getPrototypeOf(ctx,obj);
      uVar3 = (ulong)JVar8.u.ptr & 0xffffffff00000000;
    }
    else {
      JVar1 = (JSValueUnion)((JSValueUnion *)(*(long *)((long)obj.u.ptr + 0x18) + 0x38))->ptr;
      if ((int *)JVar1.ptr == (int *)0x0) {
        JVar8 = (JSValue)(ZEXT816(2) << 0x40);
        uVar3 = 0;
      }
      else {
        *(int *)JVar1.ptr = *JVar1.ptr + 1;
        uVar3 = (ulong)JVar1.ptr & 0xffffffff00000000;
        JVar8.tag = -1;
        JVar8.u.ptr = JVar1.ptr;
      }
    }
    goto LAB_0011befd;
  }
  lVar5 = 0x48;
  lVar6 = 0x40;
  iVar4 = 2;
  JVar1.float64 = 0.0;
  switch(iVar2) {
  case 0:
    break;
  case 1:
    lVar5 = 0x68;
    lVar6 = 0x60;
    break;
  case -8:
    lVar5 = 0x78;
    lVar6 = 0x70;
    break;
  case -7:
    lVar5 = 0x58;
    lVar6 = 0x50;
    break;
  case -6:
  case -5:
  case -4:
  case -3:
  case -2:
  case -1:
    goto switchD_0011bea3_caseD_fffffffa;
  default:
    if (iVar2 == 7) break;
    goto switchD_0011bea3_caseD_fffffffa;
  }
  JVar1 = (JSValueUnion)((JSValueUnion *)((long)&ctx->class_proto->u + lVar6))->ptr;
  iVar4 = *(int64_t *)((long)&ctx->class_proto->u + lVar5);
  if (0xfffffff4 < (uint)iVar4) {
    *(int *)JVar1.ptr = *JVar1.ptr + 1;
  }
switchD_0011bea3_caseD_fffffffa:
  JVar8.tag = iVar4;
  JVar8.u.ptr = JVar1.ptr;
  uVar3 = (ulong)JVar1.ptr & 0xffffffff00000000;
LAB_0011befd:
  JVar7.tag = JVar8.tag;
  JVar7.u.ptr = (void *)((ulong)JVar8.u.ptr & 0xffffffff | uVar3);
  return JVar7;
}

Assistant:

JSValue JS_GetPrototype(JSContext *ctx, JSValueConst obj)
{
    JSValue val;
    if (JS_VALUE_GET_TAG(obj) == JS_TAG_OBJECT) {
        JSObject *p;
        p = JS_VALUE_GET_OBJ(obj);
        if (unlikely(p->class_id == JS_CLASS_PROXY)) {
            val = js_proxy_getPrototypeOf(ctx, obj);
        } else {
            p = p->shape->proto;
            if (!p)
                val = JS_NULL;
            else
                val = JS_DupValue(ctx, JS_MKPTR(JS_TAG_OBJECT, p));
        }
    } else {
        val = JS_DupValue(ctx, JS_GetPrototypePrimitive(ctx, obj));
    }
    return val;
}